

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_base64.c
# Opt level: O3

void cmime_base64_decode_file(FILE *infile,FILE *outfile)

{
  undefined8 uVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined8 in_RAX;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  char cVar10;
  long lVar11;
  ulong uVar12;
  undefined8 uStack_38;
  uchar out [3];
  uchar in [4];
  
  uStack_38 = in_RAX;
  iVar4 = feof((FILE *)infile);
  if (iVar4 == 0) {
    lVar11 = 0;
    iVar4 = 0;
LAB_0010a8d3:
    do {
      iVar5 = feof((FILE *)infile);
      if (iVar5 == 0) {
        iVar5 = feof((FILE *)infile);
        if (iVar5 == 0) {
          do {
            uVar6 = getc((FILE *)infile);
            if ((uVar6 & 0xff) - 0x7b < 0xffffffb0) {
              cVar10 = '\0';
            }
            else {
              cVar10 = "|$$$}rstuvwxyz{$$$$$$$>?@ABCDEFGHIJKLMNOPQRSTUVW$$$$$$XYZ[\\]^_`abcdefghijklmnopq"
                       [(uVar6 & 0xff) - 0x2b] + -0x3d;
              if ("|$$$}rstuvwxyz{$$$$$$$>?@ABCDEFGHIJKLMNOPQRSTUVW$$$$$$XYZ[\\]^_`abcdefghijklmnopq"
                  [(uVar6 & 0xff) - 0x2b] == '$') {
                cVar10 = '\0';
              }
            }
            iVar5 = feof((FILE *)infile);
          } while ((iVar5 == 0) && (cVar10 == '\0'));
          iVar5 = feof((FILE *)infile);
          if (iVar5 != 0) goto LAB_0010a958;
          iVar4 = iVar4 + 1;
          if (cVar10 != '\0') {
            *(char *)((long)&uStack_38 + lVar11 + 4) = cVar10 + -1;
          }
        }
        else {
          iVar5 = feof((FILE *)infile);
          if (iVar5 == 0) {
            iVar4 = iVar4 + 1;
          }
          else {
LAB_0010a958:
            *(undefined1 *)((long)&uStack_38 + lVar11 + 4) = 0;
          }
        }
        lVar11 = lVar11 + 1;
        if (lVar11 != 4) goto LAB_0010a8d3;
      }
      uVar1 = uStack_38;
      if (iVar4 != 0) {
        bVar2 = uStack_38._4_1_ << 2;
        bVar8 = uStack_38._5_1_ >> 4;
        bVar7 = uStack_38._5_1_ << 4;
        uStack_38._6_1_ = SUB81(uVar1,6);
        bVar9 = uStack_38._6_1_ >> 2;
        uStack_38._7_1_ = SUB81(uVar1,7);
        bVar3 = uStack_38._6_1_ << 6 | uStack_38._7_1_;
        uStack_38._4_4_ = SUB84(uVar1,4);
        uStack_38._0_4_ =
             CONCAT13(bVar3,CONCAT12(bVar9 | bVar7,CONCAT11(bVar8 | bVar2,(undefined1)uStack_38)));
        if (1 < iVar4) {
          uVar12 = 0;
          do {
            putc((uint)*(byte *)((long)&uStack_38 + uVar12 + 1),(FILE *)outfile);
            uVar12 = uVar12 + 1;
          } while (iVar4 - 1 != uVar12);
        }
      }
      iVar5 = feof((FILE *)infile);
      lVar11 = 0;
      iVar4 = 0;
    } while (iVar5 == 0);
  }
  return;
}

Assistant:

void cmime_base64_decode_file(FILE *infile, FILE *outfile) {
    unsigned char in[4], out[3], v;
    int i, len;

    while(!feof(infile)) {
        for(len = 0, i = 0; i < 4 && !feof(infile); i++) {
            v = 0;
            while(!feof(infile) && (v == 0)) {
                v = (unsigned char) getc( infile );
                v = (unsigned char) ((v < 43 || v > 122) ? 0 : cd64[ v - 43 ]);
                if( v ) {
                    v = (unsigned char) ((v == '$') ? 0 : v - 61);
                }
            }
            
            if(!feof(infile)) {
                len++;
                if(v) {
                    in[ i ] = (unsigned char) (v - 1);
                }
            } else {
                in[i] = 0;
            }
        }
        if(len) {
            cmime_base64_decode_block(in, out);
            for(i = 0; i < len - 1; i++) {
                putc(out[i], outfile);
            }
    }
    }
}